

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_rawseti(lua_State *L,int idx,int n)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  
  pTVar2 = index2adr(L,idx);
  pTVar1 = L->top;
  pTVar3 = luaH_setnum(L,&((pTVar2->value).gc)->h,n);
  pTVar3->value = pTVar1[-1].value;
  pTVar3->tt = pTVar1[-1].tt;
  if (((3 < L->top[-1].tt) && ((((L->top[-1].value.gc)->gch).marked & 3) != 0)) &&
     (((((pTVar2->value).gc)->gch).marked & 4) != 0)) {
    luaC_barrierback(L,&((pTVar2->value).gc)->h);
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti (lua_State *L, int idx, int n) {
  StkId o;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2adr(L, idx);
  api_check(L, ttistable(o));
  setobj2t(L, luaH_setnum(L, hvalue(o), n), L->top-1);
  luaC_barriert(L, hvalue(o), L->top-1);
  L->top--;
  lua_unlock(L);
}